

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O3

void remove_recolour(opr_rbtree *head,opr_rbtree_node *parent,opr_rbtree_node *node)

{
  opr_rbtree_node *left;
  opr_rbtree_node *poVar1;
  opr_rbtree_node *right;
  opr_rbtree_node *poVar2;
  opr_rbtree_node *poVar3;
  opr_rbtree *poVar4;
  
  do {
    if ((node != (opr_rbtree_node *)0x0) && (node->red != 0)) goto LAB_00110616;
    if (node == head->root) goto LAB_00110611;
    poVar1 = parent->left;
    if (poVar1 == node) {
      poVar1 = parent->right;
      if (poVar1->red != 0) {
        poVar1->red = 0;
        parent->red = 1;
        poVar3 = poVar1->left;
        parent->right = poVar3;
        if (poVar3 != (opr_rbtree_node *)0x0) {
          poVar3->parent = parent;
        }
        poVar1->left = parent;
        poVar3 = parent->parent;
        poVar1->parent = poVar3;
        poVar4 = head;
        if (poVar3 != (opr_rbtree_node *)0x0) {
          poVar4 = (opr_rbtree *)(&poVar3->left + (poVar3->left != parent));
        }
        poVar4->root = poVar1;
        parent->parent = poVar1;
        poVar1 = parent->right;
      }
      poVar3 = poVar1->left;
      if ((poVar3 == (opr_rbtree_node *)0x0) || (poVar3->red == 0)) {
        poVar2 = poVar1->right;
        if ((poVar2 == (opr_rbtree_node *)0x0) || (poVar2->red == 0)) goto LAB_001104d4;
LAB_0011056f:
        if (poVar2->red == 0) goto LAB_00110575;
      }
      else {
        poVar2 = poVar1->right;
        if (poVar2 != (opr_rbtree_node *)0x0) goto LAB_0011056f;
LAB_00110575:
        poVar3->red = 0;
        poVar1->red = 1;
        poVar2 = poVar3->right;
        poVar1->left = poVar2;
        if (poVar2 != (opr_rbtree_node *)0x0) {
          poVar2->parent = poVar1;
        }
        poVar3->right = poVar1;
        poVar2 = poVar1->parent;
        poVar3->parent = poVar2;
        poVar4 = head;
        if (poVar2 != (opr_rbtree_node *)0x0) {
          poVar4 = (opr_rbtree *)(&poVar2->left + (poVar2->left != poVar1));
        }
        poVar4->root = poVar3;
        poVar1->parent = poVar3;
        poVar1 = parent->right;
        poVar3 = poVar1->left;
        poVar2 = poVar1->right;
      }
      poVar1->red = parent->red;
      parent->red = 0;
      poVar2->red = 0;
      parent->right = poVar3;
      if (poVar3 != (opr_rbtree_node *)0x0) {
        poVar3->parent = parent;
      }
      poVar1->left = parent;
      goto LAB_001105ea;
    }
    if (poVar1->red != 0) {
      poVar1->red = 0;
      parent->red = 1;
      poVar3 = poVar1->right;
      parent->left = poVar3;
      if (poVar3 != (opr_rbtree_node *)0x0) {
        poVar3->parent = parent;
      }
      poVar1->right = parent;
      poVar3 = parent->parent;
      poVar1->parent = poVar3;
      poVar4 = head;
      if (poVar3 != (opr_rbtree_node *)0x0) {
        poVar4 = (opr_rbtree *)(&poVar3->left + (poVar3->left != parent));
      }
      poVar4->root = poVar1;
      parent->parent = poVar1;
      poVar1 = parent->left;
    }
    poVar3 = poVar1->left;
    if ((poVar3 != (opr_rbtree_node *)0x0) && (poVar3->red != 0)) goto LAB_0011053f;
    poVar2 = poVar1->right;
    if ((poVar2 != (opr_rbtree_node *)0x0) && (poVar2->red != 0)) break;
LAB_001104d4:
    poVar1->red = 1;
    node = parent;
    parent = parent->parent;
  } while( true );
  if (poVar3 != (opr_rbtree_node *)0x0) {
    if (poVar3->red != 0) goto LAB_0011053f;
    poVar2 = poVar1->right;
  }
  poVar2->red = 0;
  poVar1->red = 1;
  poVar3 = poVar2->left;
  poVar1->right = poVar3;
  if (poVar3 != (opr_rbtree_node *)0x0) {
    poVar3->parent = poVar1;
  }
  poVar2->left = poVar1;
  poVar3 = poVar1->parent;
  poVar2->parent = poVar3;
  poVar4 = head;
  if (poVar3 != (opr_rbtree_node *)0x0) {
    poVar4 = (opr_rbtree *)(&poVar3->left + (poVar3->left != poVar1));
  }
  poVar4->root = poVar2;
  poVar1->parent = poVar2;
  poVar1 = parent->left;
  poVar3 = poVar1->left;
LAB_0011053f:
  poVar1->red = parent->red;
  parent->red = 0;
  poVar3->red = 0;
  poVar3 = poVar1->right;
  parent->left = poVar3;
  if (poVar3 != (opr_rbtree_node *)0x0) {
    poVar3->parent = parent;
  }
  poVar1->right = parent;
LAB_001105ea:
  poVar3 = parent->parent;
  poVar1->parent = poVar3;
  poVar4 = head;
  if (poVar3 != (opr_rbtree_node *)0x0) {
    poVar4 = (opr_rbtree *)(&poVar3->left + (poVar3->left != parent));
  }
  poVar4->root = poVar1;
  parent->parent = poVar1;
  node = head->root;
LAB_00110611:
  if (node != (opr_rbtree_node *)0x0) {
LAB_00110616:
    node->red = 0;
  }
  return;
}

Assistant:

static void remove_recolour(struct opr_rbtree *head,
			    struct opr_rbtree_node *parent,
			    struct opr_rbtree_node *node)
{
	struct opr_rbtree_node *other;

	while ((node == NULL || !node->red) && node != head->root) {
		if (parent->left == node) {
			other = parent->right;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateleft(head, parent);
				other = parent->right;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if ((other->right == NULL) ||
				    (!other->right->red)) {
					other->left->red = 0;
					other->red = 1;
					rotateright(head, other);
					other = parent->right;
				}
				other->red = parent->red;
				parent->red = 0;
				other->right->red = 0;
				rotateleft(head, parent);
				node = head->root;
				break;
			}
		} else {
			other = parent->left;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateright(head, parent);
				other = parent->left;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if (other->left == NULL || !other->left->red) {
					other->right->red = 0;
					other->red = 1;
					rotateleft(head, other);
					other = parent->left;
				}
				other->red = parent->red;
				parent->red = 0;
				other->left->red = 0;
				rotateright(head, parent);
				node = head->root;
				break;
			}
		}
	}
	if (node)
		node->red = 0;
}